

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O2

int AF_A_FireRailgunLeft(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  void *pvVar3;
  AActor *self;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00521c39;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_00521b7c:
        self = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00521c39;
        }
      }
      if (numparam != 1) {
        VVar1 = param[1].field_0.field_3.Type;
        if (VVar1 != 0xff) {
          if (VVar1 != '\x03') goto LAB_00521c29;
          this = (DObject *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (this != (DObject *)0x0) {
              bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
              if (!bVar2) {
                __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_00521c39;
              }
            }
          }
          else if (this != (DObject *)0x0) goto LAB_00521c29;
        }
        if ((2 < (uint)numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) {
          if (VVar1 == '\x03') {
            pvVar3 = param[2].field_0.field_1.a;
            if (param[2].field_0.field_1.atag == 8) goto LAB_00521bf1;
            if (pvVar3 == (void *)0x0) goto LAB_00521bef;
          }
          __assertion = 
          "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
          ;
          goto LAB_00521c39;
        }
      }
LAB_00521bef:
      pvVar3 = (void *)0x0;
LAB_00521bf1:
      if (pvVar3 == (void *)0x0 || self->player == (player_t *)0x0) {
        bVar2 = false;
      }
      else {
        bVar2 = *(int *)((long)pvVar3 + 8) == 1;
      }
      FireRailgun(self,-10,bVar2);
      return 0;
    }
    if (self == (AActor *)0x0) goto LAB_00521b7c;
  }
LAB_00521c29:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00521c39:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                ,0x24f,"int AF_A_FireRailgunLeft(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireRailgunLeft)
{
	PARAM_ACTION_PROLOGUE;
	FireRailgun(self, -10, ACTION_CALL_FROM_PSPRITE());
	return 0;
}